

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::Matcher<const_phmap::priv::hash_internal::Enum_&>::Matcher
          (Matcher<const_phmap::priv::hash_internal::Enum_&> *this,Enum *value)

{
  MatcherBase<const_phmap::priv::hash_internal::Enum_&> local_28;
  
  (this->super_MatcherBase<const_phmap::priv::hash_internal::Enum_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_phmap::priv::hash_internal::Enum_&>).buffer_.ptr = (void *)0x0;
  (this->super_MatcherBase<const_phmap::priv::hash_internal::Enum_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00222318;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<phmap::priv::hash_internal::Enum_const&>::
       GetVTable<testing::internal::MatcherBase<phmap::priv::hash_internal::Enum_const&>::ValuePolicy<testing::internal::EqMatcher<phmap::priv::hash_internal::Enum>,true>>()
       ::kVTable;
  local_28.buffer_.i._4_4_ = 0;
  local_28.buffer_.i._0_4_ = *value;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00222318;
  internal::MatcherBase<const_phmap::priv::hash_internal::Enum_&>::operator=
            (&this->super_MatcherBase<const_phmap::priv::hash_internal::Enum_&>,&local_28);
  internal::MatcherBase<const_phmap::priv::hash_internal::Enum_&>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}